

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall
QMakeParser::finalizeCond(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int wordCount)

{
  ushort *puVar1;
  bool bVar2;
  int iVar3;
  undefined2 *puVar4;
  iterator iVar5;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (wordCount != 0) {
    if (wordCount != 1) {
      psVar6 = (storage_type *)
               QByteArrayView::lengthHelperCharArray("Extra characters after test expression.",0x28)
      ;
      QVar7.m_data = psVar6;
      QVar7.m_size = (qsizetype)&QStack_48;
      QString::fromLatin1(QVar7);
      bogusTest(this,tokPtr,(QString *)&QStack_48);
      goto LAB_002060a1;
    }
    if ((*uc == 9) && (uc + (ulong)uc[3] + 4 == ptr)) {
      QString::setRawData((QChar *)&this->m_tmp,(longlong)(uc + 4));
      iVar3 = QString::compare((QString *)&this->m_tmp,0x26b850);
      if (iVar3 == 0) {
        bVar2 = failOperator(this,"in front of else");
        if (!bVar2) {
          iVar5 = QList<QMakeParser::BlockScope>::end
                            (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
          if ((this->m_canElse != true) ||
             ((iVar5.i[-1].special == true && (iVar5.i[-1].braceLevel == 0)))) {
            do {
              iVar5 = QList<QMakeParser::BlockScope>::end
                                (&(this->m_blockstack).super_QList<QMakeParser::BlockScope>);
              if (iVar5.i[-1].inBranch == true) {
                if ((iVar5.i[-1].special != true) || (iVar5.i[-1].braceLevel != 0)) {
                  iVar5.i[-1].inBranch = false;
                  goto LAB_00206181;
                }
              }
              else if (iVar5.i[-1].braceLevel != 0) goto LAB_00206130;
              if ((this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size == 1)
              goto LAB_00206130;
              leaveScope(this,tokPtr);
            } while( true );
          }
          puVar1 = *tokPtr;
          puVar1[0] = 0x18;
          puVar1[1] = 0;
          *tokPtr = puVar1 + 3;
          puVar1[2] = 0;
LAB_00206181:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            enterScope(this,tokPtr,false,StCtrl);
            return;
          }
          goto LAB_002061ae;
        }
        goto LAB_002060a6;
      }
    }
    finalizeTest(this,tokPtr);
    memcpy(*tokPtr,uc,(long)ptr - (long)uc & 0xffffffff);
    puVar4 = (undefined2 *)((long)*tokPtr + ((long)ptr - (long)uc & 0x1fffffffeU));
    *tokPtr = puVar4 + 1;
    *puVar4 = 0x10;
  }
  goto LAB_002060a6;
LAB_00206130:
  psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray("Unexpected \'else\'.",0x13);
  QVar8.m_data = psVar6;
  QVar8.m_size = (qsizetype)&QStack_48;
  QString::fromLatin1(QVar8);
  parseError(this,(QString *)&QStack_48);
LAB_002060a1:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
LAB_002060a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002061ae:
  __stack_chk_fail();
}

Assistant:

void QMakeParser::finalizeCond(ushort *&tokPtr, ushort *uc, ushort *ptr, int wordCount)
{
    if (wordCount != 1) {
        if (wordCount)
            bogusTest(tokPtr, fL1S("Extra characters after test expression."));
        return;
    }

    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (uce == ptr) {
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            if (!m_tmp.compare(statics.strelse, Qt::CaseInsensitive)) {
                if (failOperator("in front of else"))
                    return;
                BlockScope &top = m_blockstack.top();
                if (m_canElse && (!top.special || top.braceLevel)) {
                    // A list of tests (the last one likely with side effects),
                    // but no assignment, scope, etc.
                    putTok(tokPtr, TokBranch);
                    // Put empty then block
                    putBlockLen(tokPtr, 0);
                    enterScope(tokPtr, false, StCtrl);
                    return;
                }
                forever {
                    BlockScope &top = m_blockstack.top();
                    if (top.inBranch && (!top.special || top.braceLevel)) {
                        top.inBranch = false;
                        enterScope(tokPtr, false, StCtrl);
                        return;
                    }
                    if (top.braceLevel || m_blockstack.size() == 1)
                        break;
                    leaveScope(tokPtr);
                }
                parseError(fL1S("Unexpected 'else'."));
                return;
            }
        }
    }